

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCore.c
# Opt level: O3

int Fra_FraigMiterStatus(Aig_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar4 = 0;
  if (p->pData == (void *)0x0) {
    uVar4 = p->nRegs;
    iVar1 = p->nObjs[3];
    if (iVar1 - uVar4 == 0 || iVar1 < (int)uVar4) {
      uVar4 = 1;
    }
    else {
      uVar6 = p->vCos->nSize;
      iVar3 = 0;
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      if (uVar6 <= iVar1 + ~uVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar7 = 0;
      iVar5 = 0;
      do {
        pAVar2 = *(Aig_Obj_t **)((long)p->vCos->pArray[uVar7] + 8);
        if (pAVar2 != (Aig_Obj_t *)((ulong)p->pConst1 ^ 1)) {
          if (pAVar2 != p->pConst1) {
            uVar6 = (uint)*(undefined8 *)((int *)((ulong)pAVar2 & 0xfffffffffffffffe) + 6);
            if ((((uVar6 & 7) != 2) || (p->nTruePis <= *(int *)((ulong)pAVar2 & 0xfffffffffffffffe))
                ) && ((((uint)pAVar2 ^ uVar6 >> 3) & 1) == 0)) {
              iVar3 = iVar3 + 1;
              goto LAB_005d106f;
            }
          }
          iVar5 = iVar5 + 1;
        }
LAB_005d106f:
        uVar7 = uVar7 + 1;
      } while (iVar1 - uVar4 != uVar7);
      uVar4 = -(uint)(iVar3 != 0) | 1;
      if (iVar5 != 0) {
        uVar4 = 0;
      }
    }
  }
  return uVar4;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

/* 
    Speculating reduction in the sequential case leads to an interesting 
    situation when a counter-ex may not refine any classes. This happens
    for non-constant equivalence classes. In such cases the representative
    of the class (proved by simulation to be non-constant) may be reduced 
    to a constant during the speculative reduction. The fraig-representative 
    of this representative node is a constant node, even though this is a 
    non-constant class. Experiments have shown that this situation happens 
    very often at the beginning of the refinement iteration when there are 
    many spurious candidate equivalence classes (especially if heavy-duty 
    simulatation of BMC was node used at the beginning). As a result, the 
    SAT solver run may return a counter-ex that  distinguishes the given 
    representative node from the constant-1 node but this counter-ex
    does not distinguish the nodes in the non-costant class... This is why 
    there is no check of refinement after a counter-ex in the sequential case.
*/

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Reports the status of the miter.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Fra_FraigMiterStatus( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pChild;
    int i, CountConst0 = 0, CountNonConst0 = 0, CountUndecided = 0;
    if ( p->pData )
        return 0;
    Aig_ManForEachPoSeq( p, pObj, i )
    {
        pChild = Aig_ObjChild0(pObj);
        // check if the output is constant 0
        if ( pChild == Aig_ManConst0(p) )
        {
            CountConst0++;
            continue;
        }
        // check if the output is constant 1
        if ( pChild == Aig_ManConst1(p) )
        {
            CountNonConst0++;
            continue;
        }
        // check if the output is a primary input
        if ( Aig_ObjIsCi(Aig_Regular(pChild)) && Aig_ObjCioId(Aig_Regular(pChild)) < p->nTruePis )
        {
            CountNonConst0++;
            continue;
        }
        // check if the output can be not constant 0
        if ( Aig_Regular(pChild)->fPhase != (unsigned)Aig_IsComplement(pChild) )
        {
            CountNonConst0++;
            continue;
        }
        CountUndecided++;
    }
/*
    if ( p->pParams->fVerbose )
    {
        printf( "Miter has %d outputs. ", Aig_ManCoNum(p->pManAig) );
        printf( "Const0 = %d.  ", CountConst0 );
        printf( "NonConst0 = %d.  ", CountNonConst0 );
        printf( "Undecided = %d.  ", CountUndecided );
        printf( "\n" );
    }
*/
    if ( CountNonConst0 )
        return 0;
    if ( CountUndecided )
        return -1;
    return 1;
}